

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324.cpp
# Opt level: O0

void __thiscall
BIP324Cipher::Encrypt
          (BIP324Cipher *this,Span<const_std::byte> contents,Span<const_std::byte> aad,bool ignore,
          Span<std::byte> output)

{
  long lVar1;
  Span<const_std::byte> input;
  Span<const_std::byte> plain2;
  Span<const_std::byte> plain1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  FSChaCha20Poly1305 *this_00;
  size_t in_RCX;
  size_t in_RSI;
  byte *in_RDI;
  byte *in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  Span<std::byte> SVar5;
  Span<std::byte> SVar6;
  byte header [1];
  byte len [3];
  Span<const_std::byte> *in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  Span<std::byte> *in_stack_fffffffffffffef8;
  FSChaCha20 *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff78;
  Span<const_std::byte> in_stack_ffffffffffffffb0;
  Span<std::byte> in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_R9B & 1;
  sVar3 = Span<std::byte>::size((Span<std::byte> *)in_stack_fffffffffffffee8);
  sVar4 = Span<const_std::byte>::size(in_stack_fffffffffffffee8);
  if (sVar3 != sVar4 + 0x14) {
    __assert_fail("output.size() == contents.size() + EXPANSION",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bip324.cpp"
                  ,0x4b,
                  "void BIP324Cipher::Encrypt(Span<const std::byte>, Span<const std::byte>, bool, Span<std::byte>)"
                 );
  }
  Span<const_std::byte>::size(in_stack_fffffffffffffee8);
  Span<const_std::byte>::size(in_stack_fffffffffffffee8);
  Span<const_std::byte>::size(in_stack_fffffffffffffee8);
  std::optional<FSChaCha20>::operator->((optional<FSChaCha20> *)in_stack_fffffffffffffee8);
  Span<const_std::byte>::Span<3>(in_stack_fffffffffffffee8,(byte (*) [3])0x8b6624);
  SVar5 = Span<std::byte>::first(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  input.m_size = in_stack_ffffffffffffff78;
  input.m_data = in_RDI;
  SVar6.m_size._0_7_ = in_stack_ffffffffffffff68;
  SVar6.m_data = (byte *)SVar5.m_size;
  SVar6.m_size._7_1_ = bVar2;
  FSChaCha20::Crypt(in_stack_ffffffffffffff00,input,SVar6);
  this_00 = std::optional<FSChaCha20Poly1305>::operator->
                      ((optional<FSChaCha20Poly1305> *)in_stack_fffffffffffffee8);
  Span<const_std::byte>::Span<1>(in_stack_fffffffffffffee8,(byte (*) [1])0x8b66a2);
  SVar6 = Span<std::byte>::subspan(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  plain1.m_size = in_RSI;
  plain1.m_data = in_R8;
  plain2.m_size = in_RCX;
  plain2.m_data = (byte *)SVar6.m_size;
  FSChaCha20Poly1305::Encrypt
            (this_00,plain1,plain2,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BIP324Cipher::Encrypt(Span<const std::byte> contents, Span<const std::byte> aad, bool ignore, Span<std::byte> output) noexcept
{
    assert(output.size() == contents.size() + EXPANSION);

    // Encrypt length.
    std::byte len[LENGTH_LEN];
    len[0] = std::byte{(uint8_t)(contents.size() & 0xFF)};
    len[1] = std::byte{(uint8_t)((contents.size() >> 8) & 0xFF)};
    len[2] = std::byte{(uint8_t)((contents.size() >> 16) & 0xFF)};
    m_send_l_cipher->Crypt(len, output.first(LENGTH_LEN));

    // Encrypt plaintext.
    std::byte header[HEADER_LEN] = {ignore ? IGNORE_BIT : std::byte{0}};
    m_send_p_cipher->Encrypt(header, contents, aad, output.subspan(LENGTH_LEN));
}